

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_File_Input.cxx
# Opt level: O0

int __thiscall Fl_File_Input::handle(Fl_File_Input *this,int event)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Fl_Window *pFVar4;
  Fl_Widget_Tracker local_28;
  Fl_Widget_Tracker wp;
  int event_local;
  Fl_File_Input *this_local;
  
  wp.wp_._4_4_ = event;
  switch(event) {
  case 1:
    iVar3 = Fl::event_y();
    iVar2 = Fl_Widget::y((Fl_Widget *)this);
    handle::inButtonBar = iVar3 < iVar2 + 10;
  case 2:
  case 5:
    if (handle::inButtonBar == '\0') {
      this_local._4_4_ = Fl_Input::handle(&this->super_Fl_Input,wp.wp_._4_4_);
    }
    else {
      this_local._4_4_ = handle_button(this,wp.wp_._4_4_);
    }
    break;
  case 3:
  case 0xb:
    iVar3 = Fl_Widget::active_r((Fl_Widget *)this);
    if (iVar3 != 0) {
      iVar3 = Fl::event_y();
      iVar2 = Fl_Widget::y((Fl_Widget *)this);
      if (iVar3 < iVar2 + 10) {
        pFVar4 = Fl_Widget::window((Fl_Widget *)this);
        Fl_Window::cursor(pFVar4,FL_CURSOR_DEFAULT);
      }
      else {
        pFVar4 = Fl_Widget::window((Fl_Widget *)this);
        Fl_Window::cursor(pFVar4,FL_CURSOR_INSERT);
      }
    }
    this_local._4_4_ = 1;
    break;
  default:
    Fl_Widget_Tracker::Fl_Widget_Tracker(&local_28,(Fl_Widget *)this);
    iVar3 = Fl_Input::handle(&this->super_Fl_Input,wp.wp_._4_4_);
    if (iVar3 == 0) {
      bVar1 = false;
    }
    else {
      iVar3 = Fl_Widget_Tracker::exists(&local_28);
      if (iVar3 != 0) {
        Fl_Widget::damage((Fl_Widget *)this,'\x10');
      }
      this_local._4_4_ = 1;
      bVar1 = true;
    }
    Fl_Widget_Tracker::~Fl_Widget_Tracker(&local_28);
    if (!bVar1) {
      this_local._4_4_ = 0;
    }
  }
  return this_local._4_4_;
}

Assistant:

int						// O - TRUE if we handled event
Fl_File_Input::handle(int event) 		// I - Event
{
//  printf("handle(event = %d)\n", event);
  static char inButtonBar = 0;

  switch (event) {
    case FL_MOVE :
    case FL_ENTER :
      if (active_r()) {
	if (Fl::event_y() < (y() + DIR_HEIGHT)) 
          window()->cursor(FL_CURSOR_DEFAULT);
	else 
          window()->cursor(FL_CURSOR_INSERT);
      }

      return 1;

    case FL_PUSH :
      inButtonBar = (Fl::event_y() < (y() + DIR_HEIGHT));
    case FL_RELEASE :
    case FL_DRAG :
      if (inButtonBar) 
        return handle_button(event);
      else
        return Fl_Input::handle(event);

    default :
      { Fl_Widget_Tracker wp(this);
	if (Fl_Input::handle(event)) {
	  if (wp.exists())
	    damage(FL_DAMAGE_BAR);
	  return 1;
	}
      }
      return 0;
  }
}